

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<long>::Fill(TPZVec<long> *this,long *copy,int64_t from,int64_t numelem)

{
  long *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar7;
  
  if (numelem < -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TPZVec::Fill",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"It\'s negative parameter numelem, then numelem = ",0x30);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
  }
  auVar3 = _DAT_014d28c0;
  auVar2 = _DAT_014d28b0;
  lVar5 = 0;
  if (0 < from) {
    lVar5 = from;
  }
  lVar6 = this->fNElements;
  if (numelem < 0) {
    numelem = lVar6;
  }
  lVar7 = numelem + from;
  if (lVar6 <= numelem + from) {
    lVar7 = lVar6;
  }
  lVar6 = lVar7 - lVar5;
  if (lVar6 != 0 && lVar5 <= lVar7) {
    plVar1 = this->fStore;
    lVar7 = *copy;
    lVar8 = lVar6 + -1;
    auVar10._8_4_ = (int)lVar8;
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar9 = 0;
    auVar10 = auVar10 ^ _DAT_014d28c0;
    do {
      auVar11._8_4_ = (int)uVar9;
      auVar11._0_8_ = uVar9;
      auVar11._12_4_ = (int)(uVar9 >> 0x20);
      auVar11 = (auVar11 | auVar2) ^ auVar3;
      if ((bool)(~(auVar11._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar11._0_4_ ||
                  auVar10._4_4_ < auVar11._4_4_) & 1)) {
        plVar1[lVar5 + uVar9] = lVar7;
      }
      if ((auVar11._12_4_ != auVar10._12_4_ || auVar11._8_4_ <= auVar10._8_4_) &&
          auVar11._12_4_ <= auVar10._12_4_) {
        plVar1[lVar5 + uVar9 + 1] = lVar7;
      }
      uVar9 = uVar9 + 2;
    } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar9);
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}